

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::filter_coarsen_improve
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Reals *cand_quals
          )

{
  Int to;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  LOs edge_verts2verts;
  Read<double> vert_old_quals;
  Write<signed_char> local_178;
  Write<signed_char> local_168;
  Write<double> local_158;
  Write<double> local_148;
  Bytes keep_dirs;
  Write<double> local_128;
  Write<int> local_118;
  Write<signed_char> local_108;
  Read<double> cand_old_quals;
  Write<double> local_e8;
  Write<int> local_d8;
  Write<signed_char> local_c8;
  Read<double> edge_old_quals;
  Write<double> local_a8;
  Write<double> local_98;
  Reals elem_quals;
  Graph local_78;
  Adj verts2elems;
  
  Mesh::ask_qualities((Mesh *)&elem_quals);
  to = Mesh::dim(mesh);
  Mesh::ask_up(&verts2elems,mesh,0,to);
  Graph::Graph(&local_78,&verts2elems.super_Graph);
  Write<double>::Write(&local_98,&elem_quals.write_);
  graph_reduce<double>((Omega_h *)&vert_old_quals,&local_78,(Read<double> *)&local_98,1,OMEGA_H_MIN)
  ;
  Write<double>::~Write(&local_98);
  Graph::~Graph(&local_78);
  Write<double>::Write(&local_a8,&vert_old_quals.write_);
  Mesh::sync_array<double>((Mesh *)&edge_verts2verts,(Int)mesh,(Read<double> *)0x0,(Int)&local_a8);
  Write<double>::operator=(&vert_old_quals.write_,(Write<signed_char> *)&edge_verts2verts);
  Write<double>::~Write((Write<double> *)&edge_verts2verts);
  Write<double>::~Write(&local_a8);
  Mesh::ask_verts_of((Mesh *)&edge_verts2verts,(Int)mesh);
  Write<int>::Write(&local_d8,&edge_verts2verts.write_);
  Write<double>::Write(&local_e8,&vert_old_quals.write_);
  unmap<double>((Omega_h *)&local_c8,(LOs *)&local_d8,(Read<signed_char> *)&local_e8,1);
  read<double>((Omega_h *)&edge_old_quals,&local_c8);
  Write<double>::~Write((Write<double> *)&local_c8);
  Write<double>::~Write(&local_e8);
  Write<int>::~Write(&local_d8);
  Write<int>::Write(&local_118,&cands2edges->write_);
  Write<double>::Write(&local_128,&edge_old_quals.write_);
  unmap<double>((Omega_h *)&local_108,(LOs *)&local_118,(Read<signed_char> *)&local_128,2);
  read<double>((Omega_h *)&cand_old_quals,&local_108);
  Write<double>::~Write((Write<double> *)&local_108);
  Write<double>::~Write(&local_128);
  Write<int>::~Write(&local_118);
  Write<double>::Write(&local_148,&cand_quals->write_);
  Write<double>::Write(&local_158,&cand_old_quals.write_);
  gt_each<double>((Omega_h *)&keep_dirs,(Read<double> *)&local_148,(Read<double> *)&local_158);
  Write<double>::~Write(&local_158);
  Write<double>::~Write(&local_148);
  Write<signed_char>::Write(&local_168,&cand_codes->write_);
  Write<signed_char>::Write(&local_178,&keep_dirs.write_);
  filter_coarsen_dirs(this,(Read<signed_char> *)&local_168,(Read<signed_char> *)&local_178);
  Write<signed_char>::~Write(&local_178);
  Write<signed_char>::~Write(&local_168);
  Write<signed_char>::~Write(&keep_dirs.write_);
  Write<double>::~Write(&cand_old_quals.write_);
  Write<double>::~Write(&edge_old_quals.write_);
  Write<int>::~Write(&edge_verts2verts.write_);
  Write<double>::~Write(&vert_old_quals.write_);
  Adj::~Adj(&verts2elems);
  Write<double>::~Write(&elem_quals.write_);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_improve(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Reals cand_quals) {
  auto elem_quals = mesh->ask_qualities();
  auto verts2elems = mesh->ask_up(VERT, mesh->dim());
  auto vert_old_quals = graph_reduce(verts2elems, elem_quals, 1, OMEGA_H_MIN);
  vert_old_quals = mesh->sync_array(VERT, vert_old_quals, 1);
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto edge_old_quals = read(unmap(edge_verts2verts, vert_old_quals, 1));
  auto cand_old_quals = read(unmap(cands2edges, edge_old_quals, 2));
  auto keep_dirs = gt_each(cand_quals, cand_old_quals);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}